

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall
entityx::EventManager::
emit<entityx::ComponentRemovedEvent<Counter>,entityx::Entity,entityx::ComponentHandle<Counter,entityx::EntityManager>&>
          (EventManager *this,Entity *args,ComponentHandle<Counter,_entityx::EntityManager> *args_1)

{
  Family id;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  EventSignalPtr sig;
  ComponentRemovedEvent<Counter> event;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  undefined **local_30;
  EntityManager *local_28;
  uint64_t uStack_20;
  EntityManager *local_18;
  uint64_t uStack_10;
  
  local_28 = args->manager_;
  uStack_20 = (args->id_).id_;
  local_18 = args_1->manager_;
  uStack_10 = (args_1->id_).id_;
  local_30 = &PTR__BaseEvent_001e8b50;
  id = Event<entityx::ComponentRemovedEvent<Counter>_>::family();
  p_Var1 = &signal_for(this,id)->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  Catch::clara::std::
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,p_Var1);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
            (&(local_40._M_ptr)->
              super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,&local_30
            );
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40._M_refcount);
  entityx::BaseEvent::~BaseEvent((BaseEvent *)&local_30);
  return;
}

Assistant:

void emit(Args && ... args) {
    // Using 'E event(std::forward...)' causes VS to fail with an internal error. Hack around it.
    E event = E(std::forward<Args>(args) ...);
    auto sig = signal_for(std::size_t(Event<E>::family()));
    sig->emit(&event);
  }